

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderMaxInvocationsTest::iterate(GeometryShaderMaxInvocationsTest *this)

{
  GLuint GVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  reference pvVar9;
  bool result_of_single_invocation_pass;
  bool result_of_multiple_invocations_pass;
  Functions *gl;
  allocator<unsigned_char> local_29;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result_image;
  GeometryShaderMaxInvocationsTest *this_local;
  long lVar8;
  
  result_image.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  initTest(this);
  GVar1 = this->m_texture_width;
  std::allocator<unsigned_char>::allocator(&local_29);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,(ulong)(GVar1 * 0x24)
             ,&local_29);
  std::allocator<unsigned_char>::~allocator(&local_29);
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar5 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar8 + 0x1680))(this->m_program_object_id_for_multiple_invocations_pass);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa85);
  (**(code **)(lVar8 + 0x1c0))(0x437f0000,0,0);
  (**(code **)(lVar8 + 0x188))(0x4000);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not clear the color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa8a);
  (**(code **)(lVar8 + 0x538))(0,0,1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Call drawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa8d);
  pcVar2 = *(code **)(lVar8 + 0x1220);
  GVar1 = this->m_texture_width;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
  (*pcVar2)(0,0,GVar1,9,0x1908,0x1401,pvVar9);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not read back pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa92);
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
  bVar3 = verifyResultOfMultipleInvocationsPass(this,pvVar9);
  (**(code **)(lVar8 + 0x1680))(this->m_program_object_id_for_single_invocation_pass);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa99);
  (**(code **)(lVar8 + 0x1c0))(0x437f0000,0,0);
  (**(code **)(lVar8 + 0x188))(0x4000);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not clear the color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa9e);
  (**(code **)(lVar8 + 0x538))(0,0,1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Call drawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xaa1);
  pcVar2 = *(code **)(lVar8 + 0x1220);
  GVar1 = this->m_texture_width;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
  (*pcVar2)(0,0,GVar1,9,0x1908,0x1401,pvVar9);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not read back pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xaa6);
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
  bVar4 = verifyResultOfSingleInvocationPass(this,pvVar9);
  if ((bVar3) && (bVar4)) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderMaxInvocationsTest::iterate()
{
	initTest();

	/* Variables used for image verification purposes */
	std::vector<unsigned char> result_image(m_texture_width * m_texture_height * m_texture_pixel_size);

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Render with multiple GS invocations */
	gl.useProgram(m_program_object_id_for_multiple_invocations_pass);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program");

	gl.clearColor(255 /* red */, 0 /* green */, 0 /* blue */, 0 /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Call drawArrays() failed");

	/* Extract image from FBO */
	gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, &result_image[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixels from color buffer");

	/* Run verification */
	bool result_of_multiple_invocations_pass = verifyResultOfMultipleInvocationsPass(&result_image[0]);

	/* Render with single GS invocations */
	gl.useProgram(m_program_object_id_for_single_invocation_pass);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program");

	gl.clearColor(255 /* red */, 0 /* green */, 0 /* blue */, 0 /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Call drawArrays() failed");

	/* Extract image from FBO */
	gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, &result_image[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixels from color buffer");

	/* Run verification */
	bool result_of_single_invocation_pass = verifyResultOfSingleInvocationPass(&result_image[0]);

	/* Set test result */
	if (result_of_multiple_invocations_pass && result_of_single_invocation_pass)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}